

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

pair<unsigned_int,_const_dg::vr::AllocatedArea_*> __thiscall
dg::vr::StructureAnalyzer::getEqualArea(StructureAnalyzer *this,ValueRelations *graph,Value *ptr)

{
  bool bVar1;
  reference ppVVar2;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  *in_RDI;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar3;
  Value *equal;
  iterator __end2;
  iterator __begin2;
  VectorSet<const_llvm::Value_*> *__range2;
  AllocatedArea *area;
  uint index;
  VectorSet<const_llvm::Value_*> *in_stack_ffffffffffffff48;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  V in_stack_ffffffffffffff80;
  ValueRelations *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar4;
  __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
  local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  AllocatedArea *local_38;
  uint local_2c [7];
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> local_10;
  
  local_2c[0] = 0;
  local_38 = (AllocatedArea *)0x0;
  ValueRelations::getEqual(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  local_40 = local_58;
  local_60._M_current = (Value **)VectorSet<const_llvm::Value_*>::begin(in_stack_ffffffffffffff48);
  VectorSet<const_llvm::Value_*>::end(in_stack_ffffffffffffff48);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)in_stack_ffffffffffffff48);
    if (!bVar1) {
      iVar4 = 2;
LAB_001ef78b:
      VectorSet<const_llvm::Value_*>::~VectorSet((VectorSet<const_llvm::Value_*> *)0x1ef795);
      if (iVar4 != 1) {
        std::pair<unsigned_int,_const_dg::vr::AllocatedArea_*>::pair<int,_std::nullptr_t,_true>
                  (&local_10,(int *)&stack0xffffffffffffff64,(void **)&stack0xffffffffffffff58);
      }
      pVar3._4_4_ = 0;
      pVar3.first = local_10.first;
      pVar3.second = local_10.second;
      return pVar3;
    }
    ppVVar2 = __gnu_cxx::
              __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
              ::operator*(&local_60);
    getAllocatedAreaFor((StructureAnalyzer *)
                        CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),*ppVVar2);
    std::tie<unsigned_int,dg::vr::AllocatedArea_const*>
              (&in_stack_ffffffffffffff58->first,(AllocatedArea **)in_RDI);
    std::tuple<unsigned_int&,dg::vr::AllocatedArea_const*&>::operator=
              ((tuple<unsigned_int_&,_const_dg::vr::AllocatedArea_*&> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    if (local_38 != (AllocatedArea *)0x0) {
      std::pair<unsigned_int,_const_dg::vr::AllocatedArea_*>::
      pair<unsigned_int_&,_const_dg::vr::AllocatedArea_*&,_true>(&local_10,local_2c,&local_38);
      iVar4 = 1;
      goto LAB_001ef78b;
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::Value_**,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
    ::operator++(&local_60);
  } while( true );
}

Assistant:

std::pair<unsigned, const AllocatedArea *>
StructureAnalyzer::getEqualArea(const ValueRelations &graph,
                                const llvm::Value *ptr) const {
    unsigned index = 0;
    const AllocatedArea *area = nullptr;
    for (const auto *equal : graph.getEqual(ptr)) {
        std::tie(index, area) = getAllocatedAreaFor(equal);
        if (area)
            return {index, area};
    }
    return {0, nullptr};
}